

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O3

int __thiscall deci_FlexLexer::yyinput(deci_FlexLexer *this)

{
  int *piVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  
  *this->yy_c_buf_p = this->yy_hold_char;
  pbVar6 = (byte *)this->yy_c_buf_p;
  bVar3 = *pbVar6;
  if (bVar3 == 0) {
    do {
      if (pbVar6 < this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf + this->yy_n_chars) {
        *pbVar6 = 0;
        pbVar6 = (byte *)this->yy_c_buf_p;
LAB_001128de:
        bVar3 = *pbVar6;
        break;
      }
      pcVar2 = (this->super_FlexLexer).yytext;
      this->yy_c_buf_p = (char *)(pbVar6 + 1);
      iVar4 = yy_get_next_buffer(this);
      if (iVar4 != 1) {
        if (iVar4 != 2) {
          pbVar6 = (byte *)((this->super_FlexLexer).yytext + ((int)pbVar6 - (int)pcVar2));
          this->yy_c_buf_p = (char *)pbVar6;
          goto LAB_001128de;
        }
        (*(this->super_FlexLexer)._vptr_FlexLexer[7])(this,&this->yyin);
      }
      iVar4 = (*(this->super_FlexLexer)._vptr_FlexLexer[0xb])(this);
      if (iVar4 != 0) {
        return 0;
      }
      if (this->yy_did_buffer_switch_on_eof == 0) {
        (*(this->super_FlexLexer)._vptr_FlexLexer[7])(this,&this->yyin);
      }
      *this->yy_c_buf_p = this->yy_hold_char;
      pbVar6 = (byte *)this->yy_c_buf_p;
      bVar3 = *pbVar6;
    } while (bVar3 == 0);
  }
  *pbVar6 = 0;
  pcVar2 = this->yy_c_buf_p;
  this->yy_c_buf_p = pcVar2 + 1;
  this->yy_hold_char = pcVar2[1];
  if (bVar3 == 10) {
    piVar1 = &(this->super_FlexLexer).yylineno;
    *piVar1 = *piVar1 + 1;
    uVar5 = 10;
  }
  else {
    uVar5 = (uint)bVar3;
  }
  return uVar5;
}

Assistant:

int yyFlexLexer::yyinput()
{
	int c;
    
	*(yy_c_buf_p) = (yy_hold_char);

	if ( *(yy_c_buf_p) == YY_END_OF_BUFFER_CHAR )
		{
		/* yy_c_buf_p now points to the character we want to return.
		 * If this occurs *before* the EOB characters, then it's a
		 * valid NUL; if not, then we've hit the end of the buffer.
		 */
		if ( (yy_c_buf_p) < &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] )
			/* This was really a NUL. */
			*(yy_c_buf_p) = '\0';

		else
			{ /* need more input */
			int offset = (int) ((yy_c_buf_p) - (yytext_ptr));
			++(yy_c_buf_p);

			switch ( yy_get_next_buffer(  ) )
				{
				case EOB_ACT_LAST_MATCH:
					/* This happens because yy_g_n_b()
					 * sees that we've accumulated a
					 * token and flags that we need to
					 * try matching the token before
					 * proceeding.  But for input(),
					 * there's no matching to consider.
					 * So convert the EOB_ACT_LAST_MATCH
					 * to EOB_ACT_END_OF_FILE.
					 */

					/* Reset buffer status. */
					yyrestart( yyin );

					/*FALLTHROUGH*/

				case EOB_ACT_END_OF_FILE:
					{
					if ( yywrap(  ) )
						return 0;

					if ( ! (yy_did_buffer_switch_on_eof) )
						YY_NEW_FILE;
#ifdef __cplusplus
					return yyinput();
#else
					return input();
#endif
					}

				case EOB_ACT_CONTINUE_SCAN:
					(yy_c_buf_p) = (yytext_ptr) + offset;
					break;
				}
			}
		}

	c = *(unsigned char *) (yy_c_buf_p);	/* cast for 8-bit char's */
	*(yy_c_buf_p) = '\0';	/* preserve yytext */
	(yy_hold_char) = *++(yy_c_buf_p);

	if ( c == '\n' )
		
    yylineno++;
;

	return c;
}